

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ElabSystemTaskSymbol::reportStaticAssert
          (ElabSystemTaskSymbol *this,Scope *scope,SourceLocation loc,string_view message,
          Expression *condition)

{
  SyntaxNode *this_00;
  ConstantValue *arg;
  ConstantValue *arg_00;
  bool bVar1;
  Diagnostic *pDVar2;
  BinaryExpression *pBVar3;
  BinaryExpressionSyntax *pBVar4;
  SourceLocation noteLocation;
  Expression *this_01;
  string_view arg_01;
  allocator<char> local_59;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string local_48;
  
  this_01 = (Expression *)message._M_str;
  local_58._M_str = (char *)message._M_len;
  local_58._M_len = (size_t)loc;
  if (((this_01 != (Expression *)0x0) && (this_01->constant != (ConstantValue *)0x0)) &&
     (bVar1 = ConstantValue::isTrue(this_01->constant), bVar1)) {
    return;
  }
  pDVar2 = Scope::addDiag((Scope *)this,(DiagCode)0x8f0006,(SourceLocation)scope);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_48,&local_58,&local_59);
  pDVar2 = Diagnostic::addStringAllowEmpty(pDVar2,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (((this_01 != (Expression *)0x0) && (this_01->kind == BinaryOp)) &&
     (pBVar3 = Expression::as<slang::ast::BinaryExpression>(this_01), pBVar3->op - Equality < 10)) {
    this_00 = &((pBVar3->super_Expression).syntax)->super_SyntaxNode;
    if (this_00 == (SyntaxNode *)0x0) {
      assert::assertFailed
                ("expr.syntax",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x29b,"void slang::ast::reduceComparison(const BinaryExpression &, Diagnostic &)")
      ;
    }
    pBVar4 = slang::syntax::SyntaxNode::as<slang::syntax::BinaryExpressionSyntax>(this_00);
    arg = pBVar3->left_->constant;
    if ((arg == (ConstantValue *)0x0) ||
       (arg_00 = pBVar3->right_->constant, arg_00 == (ConstantValue *)0x0)) {
      assert::assertFailed
                ("lc && rc",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x2a0,"void slang::ast::reduceComparison(const BinaryExpression &, Diagnostic &)")
      ;
    }
    noteLocation = parsing::Token::location(&pBVar4->operatorToken);
    pDVar2 = Diagnostic::addNote(pDVar2,(DiagCode)0xa70006,noteLocation);
    Diagnostic::operator<<(pDVar2,(pBVar3->super_Expression).sourceRange);
    pDVar2 = Diagnostic::operator<<(pDVar2,arg);
    arg_01 = parsing::Token::rawText(&pBVar4->operatorToken);
    pDVar2 = Diagnostic::operator<<(pDVar2,arg_01);
    Diagnostic::operator<<(pDVar2,arg_00);
  }
  return;
}

Assistant:

void ElabSystemTaskSymbol::reportStaticAssert(const Scope& scope, SourceLocation loc,
                                              string_view message, const Expression* condition) {
    if (condition && condition->constant) {
        // Issue no diagnostic if the assert condition is true.
        if (condition->constant->isTrue())
            return;
    }

    auto& diag = scope.addDiag(diag::StaticAssert, loc).addStringAllowEmpty(std::string(message));

    // If the condition is a comparison operator, note the value of both
    // sides to provide more info about why the assertion failed.
    if (condition && condition->kind == ExpressionKind::BinaryOp)
        reduceComparison(condition->as<BinaryExpression>(), diag);
}